

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::HttpClient::Response> * __thiscall
kj::_::NullableValue<kj::HttpClient::Response>::operator=
          (NullableValue<kj::HttpClient::Response> *this,
          NullableValue<kj::HttpClient::Response> *other)

{
  Response *params;
  NullableValue<kj::HttpClient::Response> *other_local;
  NullableValue<kj::HttpClient::Response> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::HttpClient::Response>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::HttpClient::Response>(&(other->field_1).value);
      ctor<kj::HttpClient::Response,kj::HttpClient::Response>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }